

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O2

void __thiscall
transition_guard_moved_into_transition_size_Test::TestBody
          (transition_guard_moved_into_transition_size_Test *this)

{
  int iVar1;
  undefined8 uVar2;
  char *in_R9;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
  transition;
  AssertionResult gtest_ar_;
  string local_30;
  
  std::make_unique<int,int_const&>((int *)&gtest_ar_);
  uVar2 = gtest_ar_._0_8_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  transition.super_anon_class_8_1_54a39818.x._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (anon_class_8_1_54a39818)(anon_class_8_1_54a39818)uVar2;
  local_30._M_dataplus._M_p = (char *)0x0;
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&local_30);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&gtest_ar_);
  iVar1 = *(int *)uVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = 0x29 < iVar1;
  if (iVar1 < 0x2a) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&gtest_ar_,(AssertionResult *)"transition.guard(e2{threshold})"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x84,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_30);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       *(int *)transition.super_anon_class_8_1_54a39818.x._M_t.
               super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl < 0x2b;
  if (0x2a < *(int *)transition.super_anon_class_8_1_54a39818.x._M_t.
                     super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&gtest_ar_,
               (AssertionResult *)"transition.guard(e2{threshold + 1})","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x85,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_30);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&transition);
  return;
}

Assistant:

TEST(transition, guard_moved_into_transition_size) {
    static constexpr int threshold = 42;

    auto transition = make_transition(
        state<s1>,
        event<e2>,
        [x = std::make_unique<int>(threshold)](const e2 e) { return e.value > *x; },
        _,
        _);

    EXPECT_FALSE(transition.guard(e2{threshold}));
    EXPECT_TRUE(transition.guard(e2{threshold + 1}));
}